

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grovepi.c
# Opt level: O0

mraa_platform_t mraa_grovepi_platform(mraa_board_t *board,int i2c_bus)

{
  _board_t *__ptr;
  mraa_pininfo_t *pmVar1;
  mraa_adv_func_t *pmVar2;
  mraa_pincapabilities_t local_60;
  mraa_pincapabilities_t local_5c;
  mraa_pincapabilities_t local_58;
  mraa_pincapabilities_t local_54;
  mraa_pincapabilities_t local_50;
  mraa_pincapabilities_t local_4c;
  mraa_pincapabilities_t local_48;
  mraa_pincapabilities_t local_44;
  mraa_pincapabilities_t local_40;
  mraa_pincapabilities_t local_3c;
  mraa_pincapabilities_t local_38;
  mraa_pincapabilities_t local_34;
  mraa_pincapabilities_t local_30;
  mraa_pincapabilities_t local_2c;
  mraa_board_t *b;
  int i2c_bus_local;
  mraa_board_t *board_local;
  
  __ptr = (_board_t *)calloc(1,0x5f0);
  if (__ptr == (_board_t *)0x0) {
    board_local._4_4_ = MRAA_NULL_PLATFORM;
  }
  else {
    grovepi_bus = mraa_i2c_init(i2c_bus);
    if (grovepi_bus == (mraa_i2c_context)0x0) {
      syslog(4,"grovepi: Failed to initialize i2c bus %d",(ulong)(uint)i2c_bus);
      free(__ptr);
      board_local._4_4_ = MRAA_NULL_PLATFORM;
    }
    else {
      mraa_i2c_address(grovepi_bus,'\x04');
      __ptr->platform_name = "grovepi";
      __ptr->platform_version = "1.2.7";
      __ptr->platform_type = MRAA_GROVEPI;
      __ptr->gpio_count = 10;
      __ptr->aio_count = 4;
      __ptr->adc_supported = 10;
      __ptr->phy_pin_count = 0xe;
      __ptr->pwm_min_period = 0x800;
      __ptr->pwm_max_period = 0x800;
      pmVar1 = (mraa_pininfo_t *)calloc((long)__ptr->phy_pin_count,0x2f4);
      __ptr->pins = pmVar1;
      if (__ptr->pins == (mraa_pininfo_t *)0x0) {
        free(__ptr);
        board_local._4_4_ = MRAA_NULL_PLATFORM;
      }
      else {
        strncpy(__ptr->pins->name,"IO0",8);
        local_2c._0_1_ = 3;
        __ptr->pins->capabilities = local_2c;
        (__ptr->pins->gpio).pinmap = 0;
        strncpy(__ptr->pins[1].name,"IO1",8);
        local_30._0_1_ = 3;
        __ptr->pins[1].capabilities = local_30;
        __ptr->pins[1].gpio.pinmap = 1;
        strncpy(__ptr->pins[2].name,"IO2",8);
        local_34._0_1_ = 3;
        __ptr->pins[2].capabilities = local_34;
        __ptr->pins[2].gpio.pinmap = 2;
        strncpy(__ptr->pins[3].name,"IO3",8);
        local_38 = (mraa_pincapabilities_t)(CONCAT31(local_38._1_3_,3) | 4);
        __ptr->pins[3].capabilities = local_38;
        __ptr->pins[3].gpio.pinmap = 3;
        strncpy(__ptr->pins[4].name,"IO4",8);
        local_3c._0_1_ = 3;
        __ptr->pins[4].capabilities = local_3c;
        __ptr->pins[4].gpio.pinmap = 4;
        strncpy(__ptr->pins[5].name,"IO5",8);
        local_40 = (mraa_pincapabilities_t)(CONCAT31(local_40._1_3_,3) | 4);
        __ptr->pins[5].capabilities = local_40;
        __ptr->pins[5].gpio.pinmap = 5;
        strncpy(__ptr->pins[6].name,"IO6",8);
        local_44 = (mraa_pincapabilities_t)(CONCAT31(local_44._1_3_,3) | 4);
        __ptr->pins[6].capabilities = local_44;
        __ptr->pins[6].gpio.pinmap = 6;
        strncpy(__ptr->pins[7].name,"IO7",8);
        local_48._0_1_ = 3;
        __ptr->pins[7].capabilities = local_48;
        __ptr->pins[7].gpio.pinmap = 7;
        strncpy(__ptr->pins[8].name,"IO8",8);
        local_4c._0_1_ = 3;
        __ptr->pins[8].capabilities = local_4c;
        __ptr->pins[8].gpio.pinmap = 8;
        strncpy(__ptr->pins[9].name,"IO9",8);
        local_50 = (mraa_pincapabilities_t)(CONCAT31(local_50._1_3_,3) | 4);
        __ptr->pins[9].capabilities = local_50;
        __ptr->pins[9].gpio.pinmap = 9;
        strncpy(__ptr->pins[10].name,"A0",8);
        local_54 = (mraa_pincapabilities_t)(CONCAT31(local_54._1_3_,3) | 0x40);
        __ptr->pins[10].capabilities = local_54;
        __ptr->pins[10].gpio.pinmap = 10;
        __ptr->pins[10].aio.pinmap = 0;
        strncpy(__ptr->pins[0xb].name,"A1",8);
        local_58 = (mraa_pincapabilities_t)(CONCAT31(local_58._1_3_,3) | 0x40);
        __ptr->pins[0xb].capabilities = local_58;
        __ptr->pins[0xb].gpio.pinmap = 0xb;
        __ptr->pins[0xb].aio.pinmap = 1;
        strncpy(__ptr->pins[0xc].name,"A2",8);
        local_5c = (mraa_pincapabilities_t)(CONCAT31(local_5c._1_3_,3) | 0x40);
        __ptr->pins[0xc].capabilities = local_5c;
        __ptr->pins[0xc].gpio.pinmap = 0xc;
        __ptr->pins[0xc].aio.pinmap = 2;
        strncpy(__ptr->pins[0xd].name,"A3",8);
        local_60 = (mraa_pincapabilities_t)(CONCAT31(local_60._1_3_,3) | 0x40);
        __ptr->pins[0xd].capabilities = local_60;
        __ptr->pins[0xd].gpio.pinmap = 0xd;
        __ptr->pins[0xd].aio.pinmap = 3;
        pmVar2 = (mraa_adv_func_t *)calloc(1,0x288);
        __ptr->adv_func = pmVar2;
        if (__ptr->adv_func == (mraa_adv_func_t *)0x0) {
          free(__ptr->pins);
          free(__ptr);
          board_local._4_4_ = MRAA_NULL_PLATFORM;
        }
        else {
          __ptr->adv_func->gpio_init_internal_replace = mraa_grovepi_gpio_init_internal_replace;
          __ptr->adv_func->gpio_mode_replace = mraa_grovepi_gpio_mode_replace;
          __ptr->adv_func->gpio_dir_replace = mraa_grovepi_gpio_dir_replace;
          __ptr->adv_func->gpio_read_replace = mraa_grovepi_gpio_read_replace;
          __ptr->adv_func->gpio_write_replace = mraa_grovepi_gpio_write_replace;
          __ptr->adv_func->gpio_close_replace = mraa_grovepi_gpio_close_replace;
          __ptr->adv_func->aio_init_internal_replace = mraa_grovepi_aio_init_internal_replace;
          __ptr->adv_func->aio_read_replace = mraa_grovepi_aio_read_replace;
          __ptr->adv_func->pwm_init_internal_replace = mraa_grovepi_pwm_init_internal_replace;
          __ptr->adv_func->pwm_write_replace = mraa_grovepi_pwm_write_replace;
          __ptr->adv_func->pwm_read_replace = mraa_grovepi_pwm_read_replace;
          __ptr->adv_func->pwm_enable_replace = mraa_grovepi_pwm_enable_replace;
          __ptr->adv_func->pwm_period_replace = mraa_grovepi_pwm_period_replace;
          board->sub_platform = __ptr;
          board_local._4_4_ = __ptr->platform_type;
        }
      }
    }
  }
  return board_local._4_4_;
}

Assistant:

mraa_platform_t
mraa_grovepi_platform(mraa_board_t* board, const int i2c_bus)
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return MRAA_NULL_PLATFORM;
    }

    grovepi_bus = mraa_i2c_init(i2c_bus);
    if (grovepi_bus == NULL) {
        syslog(LOG_WARNING, "grovepi: Failed to initialize i2c bus %d", i2c_bus);
        free(b);
        return MRAA_NULL_PLATFORM;
    }
    mraa_i2c_address(grovepi_bus, GROVEPI_ADDRESS);

    b->platform_name = "grovepi";
    b->platform_version = "1.2.7"; // TODO: add firmware query function
    b->platform_type = MRAA_GROVEPI;
    b->gpio_count = 10;
    b->aio_count = 4;
    b->adc_supported = 10;
    b->phy_pin_count = 14;
    b->pwm_min_period = 2048;
    b->pwm_max_period = 2048;

    b->pins = (mraa_pininfo_t*) calloc(b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b);
        return MRAA_NULL_PLATFORM;
    }

    strncpy(b->pins[0].name, "IO0", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[0].gpio.pinmap = 0;
    strncpy(b->pins[1].name, "IO1", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[1].gpio.pinmap = 1;
    strncpy(b->pins[2].name, "IO2", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[2].gpio.pinmap = 2;
    strncpy(b->pins[3].name, "IO3", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[3].gpio.pinmap = 3;
    strncpy(b->pins[4].name, "IO4", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[4].gpio.pinmap = 4;
    strncpy(b->pins[5].name, "IO5", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[5].gpio.pinmap = 5;
    strncpy(b->pins[6].name, "IO6", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[6].gpio.pinmap = 6;
    strncpy(b->pins[7].name, "IO7", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[7].gpio.pinmap = 7;
    strncpy(b->pins[8].name, "IO8", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[8].gpio.pinmap = 8;
    strncpy(b->pins[9].name, "IO9", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[9].gpio.pinmap = 9;
    strncpy(b->pins[10].name, "A0", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[10].gpio.pinmap = 10;
    b->pins[10].aio.pinmap = 0;
    strncpy(b->pins[11].name, "A1", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[11].gpio.pinmap = 11;
    b->pins[11].aio.pinmap = 1;
    strncpy(b->pins[12].name, "A2", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[12].gpio.pinmap = 12;
    b->pins[12].aio.pinmap = 2;
    strncpy(b->pins[13].name, "A3", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[13].gpio.pinmap = 13;
    b->pins[13].aio.pinmap = 3;

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        free(b);
        return MRAA_NULL_PLATFORM;
    }

    b->adv_func->gpio_init_internal_replace = &mraa_grovepi_gpio_init_internal_replace;
    b->adv_func->gpio_mode_replace = &mraa_grovepi_gpio_mode_replace;
    b->adv_func->gpio_dir_replace = &mraa_grovepi_gpio_dir_replace;
    //TODO: add interrupt support
    //b->adv_func->gpio_edge_mode_replace = &mraa_grovepi_gpio_edge_mode_replace;
    //b->adv_func->gpio_interrupt_handler_init_replace = &mraa_grovepi_gpio_interrupt_handler_init_replace;
    //b->adv_func->gpio_wait_interrupt_replace = &mraa_grovepi_gpio_wait_interrupt_replace;
    b->adv_func->gpio_read_replace = &mraa_grovepi_gpio_read_replace;
    b->adv_func->gpio_write_replace = &mraa_grovepi_gpio_write_replace;
    b->adv_func->gpio_close_replace = &mraa_grovepi_gpio_close_replace;

    b->adv_func->aio_init_internal_replace = &mraa_grovepi_aio_init_internal_replace;
    b->adv_func->aio_read_replace = &mraa_grovepi_aio_read_replace;

    b->adv_func->pwm_init_internal_replace = &mraa_grovepi_pwm_init_internal_replace;
    b->adv_func->pwm_write_replace = &mraa_grovepi_pwm_write_replace;
    b->adv_func->pwm_read_replace = &mraa_grovepi_pwm_read_replace;
    b->adv_func->pwm_enable_replace = &mraa_grovepi_pwm_enable_replace;
    b->adv_func->pwm_period_replace = &mraa_grovepi_pwm_period_replace;

    board->sub_platform = b;

    return b->platform_type;
}